

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderCommonFunctionTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles31::Functional::FrexpCase::compare(FrexpCase *this,void **inputs,void **outputs)

{
  reference pvVar1;
  ostream *poVar2;
  Hex<8UL> HVar3;
  HexFloat local_60;
  float local_5c;
  int local_58;
  deUint32 ulpDiff0;
  int refOut1;
  float refOut0;
  int out1;
  float out0;
  float in0;
  int compNdx;
  deUint32 maxUlpDiff;
  int mantissaBits;
  Precision PStack_30;
  bool signedZero;
  int scalarSize;
  Precision precision;
  DataType type;
  void **outputs_local;
  void **inputs_local;
  FrexpCase *this_local;
  
  _precision = outputs;
  outputs_local = inputs;
  inputs_local = (void **)this;
  pvVar1 = std::
           vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ::operator[](&(this->super_CommonFunctionCase).m_spec.inputs,0);
  scalarSize = glu::VarType::getBasicType(&pvVar1->varType);
  pvVar1 = std::
           vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ::operator[](&(this->super_CommonFunctionCase).m_spec.inputs,0);
  PStack_30 = glu::VarType::getPrecision(&pvVar1->varType);
  mantissaBits = glu::getDataTypeScalarSize(scalarSize);
  maxUlpDiff._3_1_ = 0;
  compNdx = getMinMantissaBits(PStack_30);
  in0 = (float)getMaxUlpDiffFromBits(compNdx);
  out0 = 0.0;
  while( true ) {
    if (mantissaBits <= (int)out0) {
      return true;
    }
    out1 = *(uint *)((long)*outputs_local + (long)(int)out0 * 4);
    refOut0 = *(float *)((long)*_precision + (long)(int)out0 * 4);
    refOut1 = *(int *)((long)_precision[1] + (long)(int)out0 * 4);
    frexp((double)(ulong)(uint)out1,(int *)&ulpDiff0);
    local_5c = (float)getUlpDiffIgnoreZeroSign(refOut0,(float)ulpDiff0);
    if (((uint)in0 < (uint)local_5c) || (refOut1 != local_58)) break;
    out0 = (float)((int)out0 + 1);
  }
  poVar2 = std::operator<<(&(this->super_CommonFunctionCase).m_failMsg.
                            super_basic_ostream<char,_std::char_traits<char>_>,"Expected [");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)out0);
  poVar2 = std::operator<<(poVar2,"] = ");
  HexFloat::HexFloat(&local_60,(float)ulpDiff0);
  poVar2 = Functional::operator<<(poVar2,&local_60);
  poVar2 = std::operator<<(poVar2,", ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_58);
  poVar2 = std::operator<<(poVar2," with ULP threshold ");
  HVar3 = tcu::toHex<unsigned_int>((uint)in0);
  poVar2 = tcu::Format::operator<<(poVar2,HVar3);
  poVar2 = std::operator<<(poVar2,", got ULP diff ");
  HVar3 = tcu::toHex<unsigned_int>((uint)local_5c);
  tcu::Format::operator<<(poVar2,HVar3);
  return false;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type						= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision					= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize					= glu::getDataTypeScalarSize(type);
		const bool				signedZero					= false;

		const int				mantissaBits				= getMinMantissaBits(precision);
		const deUint32			maxUlpDiff					= getMaxUlpDiffFromBits(mantissaBits);

		for (int compNdx = 0; compNdx < scalarSize; compNdx++)
		{
			const float		in0			= ((const float*)inputs[0])[compNdx];
			const float		out0		= ((const float*)outputs[0])[compNdx];
			const int		out1		= ((const int*)outputs[1])[compNdx];

			float			refOut0;
			int				refOut1;

			frexp(in0, &refOut0, &refOut1);

			const deUint32	ulpDiff0	= signedZero ? getUlpDiff(out0, refOut0) : getUlpDiffIgnoreZeroSign(out0, refOut0);

			if (ulpDiff0 > maxUlpDiff || out1 != refOut1)
			{
				m_failMsg << "Expected [" << compNdx << "] = " << HexFloat(refOut0) << ", " << refOut1 << " with ULP threshold "
						  << tcu::toHex(maxUlpDiff) << ", got ULP diff " << tcu::toHex(ulpDiff0);
				return false;
			}
		}

		return true;
	}